

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_misc.cpp
# Opt level: O0

spv_result_t spvtools::val::MiscPass(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  spv_result_t sVar4;
  uint32_t uVar5;
  Function *pFVar6;
  DiagnosticStream *pDVar7;
  spv_result_t error_3;
  spv_result_t error_2;
  spv_result_t error_1;
  DiagnosticStream local_2a0;
  allocator<char> local_c1;
  string local_c0;
  uint32_t local_a0;
  allocator<char> local_99;
  uint32_t result_type;
  anon_class_1_0_00000001 local_71;
  function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_70;
  allocator<char> local_49;
  string local_48;
  undefined4 local_24;
  Instruction *pIStack_20;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  OVar3 = Instruction::opcode(inst);
  if (OVar3 == OpUndef) {
    sVar4 = anon_unknown_4::ValidateUndef((ValidationState_t *)inst_local,pIStack_20);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    local_24 = 0;
  }
  OVar3 = Instruction::opcode(pIStack_20);
  pIVar1 = inst_local;
  if (OVar3 == OpReadClockKHR) {
    sVar4 = anon_unknown_4::ValidateShaderClock((ValidationState_t *)inst_local,pIStack_20);
  }
  else {
    if (OVar3 - OpBeginInvocationInterlockEXT < 2) {
      pFVar6 = Instruction::function(pIStack_20);
      uVar5 = Function::id(pFVar6);
      pFVar6 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,
                 "OpBeginInvocationInterlockEXT/OpEndInvocationInterlockEXT require Fragment execution model"
                 ,&local_49);
      Function::RegisterExecutionModelLimitation(pFVar6,ExecutionModelFragment,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      pIVar1 = inst_local;
      pFVar6 = Instruction::function(pIStack_20);
      uVar5 = Function::id(pFVar6);
      pFVar6 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar5);
      std::
      function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>
      ::
      function<spvtools::val::MiscPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0,void>
                ((function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>
                  *)&local_70,&local_71);
      Function::RegisterLimitation(pFVar6,&local_70);
      std::
      function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
      ::~function(&local_70);
      return SPV_SUCCESS;
    }
    if (OVar3 == OpDemoteToHelperInvocation) {
      pFVar6 = Instruction::function(pIStack_20);
      uVar5 = Function::id(pFVar6);
      pFVar6 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result_type,
                 "OpDemoteToHelperInvocationEXT requires Fragment execution model",&local_99);
      Function::RegisterExecutionModelLimitation
                (pFVar6,ExecutionModelFragment,(string *)&result_type);
      std::__cxx11::string::~string((string *)&result_type);
      std::allocator<char>::~allocator(&local_99);
      return SPV_SUCCESS;
    }
    if (OVar3 == OpIsHelperInvocationEXT) {
      local_a0 = Instruction::type_id(pIStack_20);
      pIVar1 = inst_local;
      pFVar6 = Instruction::function(pIStack_20);
      uVar5 = Function::id(pFVar6);
      pFVar6 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"OpIsHelperInvocationEXT requires Fragment execution model",
                 &local_c1);
      Function::RegisterExecutionModelLimitation(pFVar6,ExecutionModelFragment,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      bVar2 = ValidationState_t::IsBoolScalarType((ValidationState_t *)inst_local,local_a0);
      if (bVar2) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag
                (&local_2a0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
      pDVar7 = DiagnosticStream::operator<<
                         (&local_2a0,(char (*) [43])"Expected bool scalar type as Result Type: ");
      OVar3 = Instruction::opcode(pIStack_20);
      _error_2 = spvOpcodeString(OVar3);
      pDVar7 = DiagnosticStream::operator<<(pDVar7,(char **)&error_2);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
      DiagnosticStream::~DiagnosticStream(&local_2a0);
      return __local._4_4_;
    }
    if (OVar3 == OpAssumeTrueKHR) {
      sVar4 = anon_unknown_4::ValidateAssumeTrue((ValidationState_t *)inst_local,pIStack_20);
    }
    else {
      if (OVar3 != OpExpectKHR) {
        return SPV_SUCCESS;
      }
      sVar4 = anon_unknown_4::ValidateExpect((ValidationState_t *)inst_local,pIStack_20);
    }
  }
  if (sVar4 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar4;
}

Assistant:

spv_result_t MiscPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpUndef:
      if (auto error = ValidateUndef(_, inst)) return error;
      break;
    default:
      break;
  }
  switch (inst->opcode()) {
    case spv::Op::OpBeginInvocationInterlockEXT:
    case spv::Op::OpEndInvocationInterlockEXT:
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Fragment,
              "OpBeginInvocationInterlockEXT/OpEndInvocationInterlockEXT "
              "require Fragment execution model");

      _.function(inst->function()->id())
          ->RegisterLimitation([](const ValidationState_t& state,
                                  const Function* entry_point,
                                  std::string* message) {
            const auto* execution_modes =
                state.GetExecutionModes(entry_point->id());

            auto find_interlock = [](const spv::ExecutionMode& mode) {
              switch (mode) {
                case spv::ExecutionMode::PixelInterlockOrderedEXT:
                case spv::ExecutionMode::PixelInterlockUnorderedEXT:
                case spv::ExecutionMode::SampleInterlockOrderedEXT:
                case spv::ExecutionMode::SampleInterlockUnorderedEXT:
                case spv::ExecutionMode::ShadingRateInterlockOrderedEXT:
                case spv::ExecutionMode::ShadingRateInterlockUnorderedEXT:
                  return true;
                default:
                  return false;
              }
            };

            bool found = false;
            if (execution_modes) {
              auto i = std::find_if(execution_modes->begin(),
                                    execution_modes->end(), find_interlock);
              found = (i != execution_modes->end());
            }

            if (!found) {
              *message =
                  "OpBeginInvocationInterlockEXT/OpEndInvocationInterlockEXT "
                  "require a fragment shader interlock execution mode.";
              return false;
            }
            return true;
          });
      break;
    case spv::Op::OpDemoteToHelperInvocationEXT:
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Fragment,
              "OpDemoteToHelperInvocationEXT requires Fragment execution "
              "model");
      break;
    case spv::Op::OpIsHelperInvocationEXT: {
      const uint32_t result_type = inst->type_id();
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Fragment,
              "OpIsHelperInvocationEXT requires Fragment execution model");
      if (!_.IsBoolScalarType(result_type))
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected bool scalar type as Result Type: "
               << spvOpcodeString(inst->opcode());
      break;
    }
    case spv::Op::OpReadClockKHR:
      if (auto error = ValidateShaderClock(_, inst)) {
        return error;
      }
      break;
    case spv::Op::OpAssumeTrueKHR:
      if (auto error = ValidateAssumeTrue(_, inst)) {
        return error;
      }
      break;
    case spv::Op::OpExpectKHR:
      if (auto error = ValidateExpect(_, inst)) {
        return error;
      }
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}